

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

int SSL_use_RSAPrivateKey_ASN1(SSL *ssl,uchar *d,long len)

{
  bool bVar1;
  RSA *__p;
  pointer rsa_00;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_30;
  UniquePtr<RSA> rsa;
  size_t der_len_local;
  uint8_t *der_local;
  SSL *ssl_local;
  
  rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)len;
  __p = RSA_private_key_from_bytes(d,len);
  std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&local_30,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar1) {
    rsa_00 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get(&local_30);
    ssl_local._4_4_ = SSL_use_RSAPrivateKey(ssl,(RSA *)rsa_00);
  }
  else {
    ERR_put_error(0x10,0,0xc,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x158);
    ssl_local._4_4_ = 0;
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return ssl_local._4_4_;
}

Assistant:

int SSL_use_RSAPrivateKey_ASN1(SSL *ssl, const uint8_t *der, size_t der_len) {
  UniquePtr<RSA> rsa(RSA_private_key_from_bytes(der, der_len));
  if (!rsa) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_ASN1_LIB);
    return 0;
  }

  return SSL_use_RSAPrivateKey(ssl, rsa.get());
}